

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv__io_check_fd(uv_loop_t *loop,int fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  epoll_event e;
  epoll_event local_28;
  
  local_28.data.fd = 0;
  local_28.events = 1;
  local_28._4_4_ = 0xffffffff;
  iVar1 = epoll_ctl(loop->backend_fd,1,fd,&local_28);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar3 = __errno_location();
    iVar1 = 0;
    if (*piVar3 != 0x11) {
      iVar1 = -*piVar3;
    }
  }
  if ((iVar1 == 0) && (iVar2 = epoll_ctl(loop->backend_fd,2,fd,&local_28), iVar2 != 0)) {
    abort();
  }
  return iVar1;
}

Assistant:

int uv__io_check_fd(uv_loop_t* loop, int fd) {
  struct epoll_event e;
  int rc;

  memset(&e, 0, sizeof(e));
  e.events = POLLIN;
  e.data.fd = -1;

  rc = 0;
  if (epoll_ctl(loop->backend_fd, EPOLL_CTL_ADD, fd, &e))
    if (errno != EEXIST)
      rc = UV__ERR(errno);

  if (rc == 0)
    if (epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &e))
      abort();

  return rc;
}